

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::ComplexOptionType1::~ComplexOptionType1(ComplexOptionType1 *this)

{
  SharedDtor((MessageLite *)this);
  return;
}

Assistant:

ComplexOptionType1::~ComplexOptionType1() {
  // @@protoc_insertion_point(destructor:proto2_unittest.ComplexOptionType1)
  SharedDtor(*this);
}